

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_zip_entry_filesize(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint *puVar1;
  jx9_value *pObj;
  uint uVar2;
  anon_union_8_3_18420de5_for_x aVar3;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (puVar1 = (uint *)((*apArg)->x).pOther, puVar1 == (uint *)0x0)) ||
     (puVar1[0x28] != 0xdead635a)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive entry");
    uVar2 = 8;
    aVar3.rVal = 0.0;
  }
  else {
    aVar3.iVal._4_4_ = 0;
    aVar3.iVal._0_4_ = *puVar1;
    uVar2 = 2;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar2;
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_filesize(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Return entry size */
	jx9_result_int64(pCtx, (jx9_int64)pEntry->nByte);
	return JX9_OK;
}